

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O2

void __thiscall
Symbol::SetHasMaybeEscapedUseInternal(Symbol *this,ByteCodeGenerator *byteCodeGenerator)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  undefined4 *puVar3;
  FuncInfo *pFVar4;
  char16_t *reason;
  
  if (this->hasMaybeEscapedUse == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Symbol.cpp"
                       ,0x81,"(!hasMaybeEscapedUse)","!hasMaybeEscapedUse");
    if (!bVar2) goto LAB_007ded8c;
    *puVar3 = 0;
  }
  if (this->symbolType == STFormal) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Symbol.cpp"
                       ,0x82,"(!this->GetIsFormal())","!this->GetIsFormal()");
    if (!bVar2) {
LAB_007ded8c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->hasMaybeEscapedUse = true;
  pFVar4 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  sourceContextId =
       Js::FunctionProxy::GetSourceContextId(&pFVar4->byteCodeFunction->super_FunctionProxy);
  pFVar4 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  functionId = Js::FunctionProxy::GetLocalFunctionId(&pFVar4->byteCodeFunction->super_FunctionProxy)
  ;
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,StackFuncPhase,sourceContextId,functionId);
  if (bVar2) {
    Output::Print(L"HasMaybeEscapedUse: %s\n",(this->name).string.ptr);
    Output::Flush();
  }
  if (this->hasFuncAssignment == true) {
    reason = L"MaybeEscapedUse";
    if (this->symbolType == STFunction) {
      reason = L"MaybeEscapedUseFuncDecl";
    }
    FuncInfo::SetHasMaybeEscapedNestedFunc(this->scope->func,reason);
    return;
  }
  return;
}

Assistant:

void Symbol::SetHasMaybeEscapedUseInternal(ByteCodeGenerator * byteCodeGenerator)
{
    Assert(!hasMaybeEscapedUse);
    Assert(!this->GetIsFormal());
    hasMaybeEscapedUse = true;
    if (PHASE_TESTTRACE(Js::StackFuncPhase, byteCodeGenerator->TopFuncInfo()->byteCodeFunction))
    {
        Output::Print(_u("HasMaybeEscapedUse: %s\n"), this->GetName().GetBuffer());
        Output::Flush();
    }
    if (this->GetHasFuncAssignment())
    {
        this->GetScope()->GetFunc()->SetHasMaybeEscapedNestedFunc(
            DebugOnly(this->symbolType == STFunction ? _u("MaybeEscapedUseFuncDecl") : _u("MaybeEscapedUse")));
    }
}